

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O2

bool __thiscall MeterPrivate::thresholdFired(MeterPrivate *this)

{
  double dVar1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
  *pQVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  double dVar8;
  
  pQVar4 = (this->ranges).d.d;
  if (pQVar4 == (QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
                 *)0x0) {
    p_Var5 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var5 = (pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  p_Var6 = &(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar4 == (QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
                 *)0x0) {
    p_Var6 = (_Rb_tree_node_base *)0x0;
  }
  dVar1 = this->value;
  while( true ) {
    if (p_Var5 == p_Var6) {
      return false;
    }
    if ((((double)p_Var5[1]._M_parent < dVar1) ||
        (dVar8 = dVar1 - (double)p_Var5[1]._M_parent, uVar7 = -(ulong)(dVar8 < -dVar8),
        (double)(~uVar7 & (ulong)dVar8 | (ulong)-dVar8 & uVar7) < 1e-06)) &&
       (dVar1 < (double)p_Var5[1]._M_left)) break;
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  }
  _Var2 = p_Var5[1]._M_color;
  _Var3 = this->currentThreshold;
  this->currentThreshold = _Var2;
  return _Var3 != _Var2;
}

Assistant:

bool
MeterPrivate::thresholdFired()
{
	bool res = false;

	for( auto it = ranges.cbegin(), last = ranges.cend(); it != last; ++it )
	{
		if( ( value > it.value().start || qAbs( value - it.value().start ) < 0.000001 ) &&
			value < it.value().stop )
		{
			if( currentThreshold != it.key() )
				res = true;

			currentThreshold = it.key();

			break;
		}
	}

	return res;
}